

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char16_t * openjtalk_getVoiceDirU16(OpenJTalk *oj,char16_t *path)

{
  char16_t *pcVar1;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else if (path == (char16_t *)0x0) {
    oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
  }
  else {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if (oj->dn_voice_dir_path[0] != '\0') {
      pcVar1 = (char16_t *)
               convert_charset_path(oj->dn_voice_dir_path,CS_UTF_8,(char *)path,CS_UTF_16LE);
      return pcVar1;
    }
    oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
  }
  return (char16_t *)0x0;
}

Assistant:

OPENJTALK_DLL_API char16_t *OPENJTALK_CONVENTION openjtalk_getVoiceDirU16(OpenJTalk *oj, char16_t *path)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}

	if (!path)
	{
		oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
		return NULL;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!oj->dn_voice_dir_path || strlen(oj->dn_voice_dir_path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return NULL;
	}
#if defined(_WIN32)
	char16_t *res = u8tou16_path(oj->dn_voice_dir_path, path);
#else
	char16_t *res = u8tou16_path(oj->dn_voice_dir_path, path);
#endif
	return res;
}